

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O3

void __thiscall
spatial_region::fout_bx(spatial_region *this,ofstream *pfout,int n0,int n,openmode mode)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((mode & ~_S_app) == (_S_out|_S_bin)) {
    write_binary<cellb>(pfout,&this->cb,getbx,n0,n,this->ny,this->nz);
  }
  else {
    if ((mode & ~_S_app) != _S_out) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"fout_bx: ERROR: wrong mode",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      return;
    }
    if (n0 < n) {
      uVar2 = (ulong)(uint)this->nz;
      lVar6 = (long)n0;
      do {
        uVar3 = (ulong)(uint)this->ny;
        if (0 < this->ny) {
          lVar4 = 0;
          do {
            poVar1 = std::ostream::_M_insert<double>
                               ((this->cb).p._M_t.
                                super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                                super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar6][lVar4]
                                [(int)(((uint)(uVar2 >> 0x1f) & 1) + (int)uVar2) >> 1].bx);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
            uVar3 = (ulong)this->ny;
            lVar4 = lVar4 + 1;
          } while (lVar4 < (long)uVar3);
          uVar2 = (ulong)(uint)this->nz;
        }
        if (0 < (int)uVar2) {
          lVar4 = 0;
          lVar5 = 0;
          do {
            poVar1 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)&(this->cb).p._M_t.
                                         super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>
                                         .super__Head_base<0UL,_cellb_***,_false>._M_head_impl
                                         [lVar6][(int)(((uint)(uVar3 >> 0x1f) & 1) + (int)uVar3) >>
                                                 1]->bx + lVar4));
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
            uVar2 = (ulong)this->nz;
            lVar5 = lVar5 + 1;
            lVar4 = lVar4 + 0x18;
          } while (lVar5 < (long)uVar2);
        }
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != n);
    }
  }
  return;
}

Assistant:

void spatial_region::fout_bx(ofstream* pfout, int n0, int n, ios_base::openmode
        mode)
{
    /* n-n0 - длина массива по x (для данного spatial_region'а) для
     * вывода сечения плоскостью xy и плоскостью xz */
    if (is_mode_non_binary(mode)) {
        for(int i=n0;i<n;i++)
        {
            int k=nz/2;
            for(int j=0;j<ny;j++)
                (*pfout)<<cb[i][j][k].bx<<"\n";
            int j=ny/2;
            for(int k=0;k<nz;k++)
                (*pfout)<<cb[i][j][k].bx<<"\n";
        }
    } else if (is_mode_binary(mode)) {
        write_binary<cellb>(pfout, cb, getbx, n0, n, ny, nz);
    } else {
        cerr << "fout_bx: ERROR: wrong mode" << endl;
    }
}